

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names_internal.cc
# Opt level: O2

string * __thiscall
upb::generator::MiniTableSubMessagesVarName_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view msg_full_name)

{
  string local_30;
  
  (anonymous_namespace)::ToCIdent_abi_cxx11_(&local_30,(_anonymous_namespace_ *)this,msg_full_name);
  std::operator+(__return_storage_ptr__,&local_30,"__submsgs");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string MiniTableSubMessagesVarName(absl::string_view msg_full_name) {
  return ToCIdent(msg_full_name) + "__submsgs";
}